

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

bool ON_XMLNodePrivate::IsValidXMLNameWithDebugging(wchar_t *tag_name)

{
  bool bVar1;
  
  bVar1 = IsValidXMLName(tag_name);
  if (!bVar1) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0x763,"","false is false");
  }
  return bVar1;
}

Assistant:

bool ON_XMLNodePrivate::IsValidXMLNameWithDebugging(const wchar_t* tag_name) // Static.
{
  if (IsValidXMLName(tag_name))
    return true;

  OUTPUT_DEBUG_STRING(L"Invalid XML tag syntax - ");
  OUTPUT_DEBUG_STRING_EOL(tag_name);

  ON_ASSERT(false);

  return false;
}